

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall Lexer::match(Lexer *this,char *x)

{
  ostream *poVar1;
  lexer_exception *this_00;
  stringstream buffer;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (this->current_ == *x) {
    advance(this);
    skip_whitespace(this);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,anon_var_dwarf_48c7b,0x11);
  local_1c8._M_dataplus._M_p._0_1_ = this->current_;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)&local_1c8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_48c94,0x11);
  local_1c8._M_dataplus._M_p._0_1_ = *x;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1c8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_48c7b + 0x10,1);
  this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  lexer_exception::lexer_exception(this_00,&this->position_,&local_1c8);
  __cxa_throw(this_00,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
}

Assistant:

void Lexer::match(const char &x) {
    if (current_ == x) {
        consume();
    } else {
        std::stringstream buffer;
        buffer << "错误的字符 '" << current_ << "', 期望得到 '" << x << "'";
        throw lexer_exception(position_, buffer.str());
    }
}